

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-rand.c
# Opt level: O2

int16_t m_bonus_calc(int max,int level,aspect bonus_aspect)

{
  int16_t iVar1;
  
  iVar1 = (int16_t)max;
  switch(bonus_aspect) {
  case MINIMISE:
    iVar1 = 0;
    break;
  case AVERAGE:
    iVar1 = (int16_t)((long)(level * max) / 0x80);
    break;
  case MAXIMISE:
  case EXTREMIFY:
    break;
  case RANDOMISE:
    iVar1 = m_bonus(max,level);
    return iVar1;
  default:
    __assert_fail("0 && \"Should never reach here\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-rand.c"
                  ,0x1ee,"int16_t m_bonus_calc(int, int, aspect)");
  }
  return iVar1;
}

Assistant:

int16_t m_bonus_calc(int max, int level, aspect bonus_aspect)
{
	switch (bonus_aspect) {
		case EXTREMIFY:
		case MAXIMISE:  return max;
		case RANDOMISE: return m_bonus(max, level);
		case MINIMISE:  return 0;
		case AVERAGE:   return max * level / MAX_RAND_DEPTH;
	}

	assert(0 && "Should never reach here");
	return 0;
}